

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

int testing::internal::SumOverTestCaseList
              (vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *case_list,
              offset_in_TestCase_to_subr method)

{
  pointer ppTVar1;
  int iVar2;
  size_t i;
  ulong uVar4;
  int iVar5;
  code *pcVar3;
  
  iVar5 = 0;
  uVar4 = 0;
  while( true ) {
    ppTVar1 = (case_list->
              super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    if ((ulong)((long)(case_list->
                      super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>)
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <= uVar4)
    break;
    pcVar3 = (code *)method;
    if ((method & 1) != 0) {
      pcVar3 = *(code **)((long)ppTVar1[uVar4]->_vptr_TestCase + (method - 1));
    }
    iVar2 = (*pcVar3)();
    iVar5 = iVar5 + iVar2;
    uVar4 = uVar4 + 1;
  }
  return iVar5;
}

Assistant:

static int SumOverTestCaseList(const std::vector<TestCase*>& case_list,
                               int (TestCase::*method)() const) {
  int sum = 0;
  for (size_t i = 0; i < case_list.size(); i++) {
    sum += (case_list[i]->*method)();
  }
  return sum;
}